

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmClientContext.cpp
# Opt level: O1

void __thiscall
GmmLib::GmmClientContext::DestroyResInfoObject
          (GmmClientContext *this,GMM_RESOURCE_INFO *pResInfo,
          GmmClientAllocationCallbacks *pAllocCbs)

{
  int iVar1;
  undefined4 extraout_var;
  PFN_ClientFreeFunction UNRECOVERED_JUMPTABLE;
  long in_FS_OFFSET;
  undefined1 local_638 [520];
  undefined1 local_430 [520];
  undefined1 local_228 [520];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (pResInfo == (GMM_RESOURCE_INFO *)0x0) {
LAB_001c6bc2:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else {
    if ((pAllocCbs == (GmmClientAllocationCallbacks *)0x0) ||
       (pAllocCbs->pfnFree == (PFN_ClientFreeFunction)0x0)) {
      UNRECOVERED_JUMPTABLE = (PFN_ClientFreeFunction)this->_vptr_GmmClientContext[0x20];
    }
    else {
      iVar1 = (*(pResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x23])(pResInfo)
      ;
      if ((*(byte *)(CONCAT44(extraout_var,iVar1) + 0xd) & 2) != 0) {
        memset(local_638,0,0x618);
        (pResInfo->super_GmmResourceInfoCommon).ClientType = GMM_KMD_VISTA;
        memset(&(pResInfo->super_GmmResourceInfoCommon).Surf,0,0x208);
        memcpy(&(pResInfo->super_GmmResourceInfoCommon).AuxSurf,local_430,0x208);
        memcpy(&(pResInfo->super_GmmResourceInfoCommon).AuxSecSurf,local_228,0x208);
        (pResInfo->super_GmmResourceInfoCommon).RotateInfo = 0;
        (pResInfo->super_GmmResourceInfoCommon).pPrivateData = 0;
        (pResInfo->super_GmmResourceInfoCommon).MultiTileArch.field_0x0 = 0;
        (pResInfo->super_GmmResourceInfoCommon).MultiTileArch.GpuVaMappingSet = '\0';
        (pResInfo->super_GmmResourceInfoCommon).MultiTileArch.LocalMemEligibilitySet = '\0';
        (pResInfo->super_GmmResourceInfoCommon).MultiTileArch.LocalMemPreferredSet = '\0';
        (pResInfo->super_GmmResourceInfoCommon).MultiTileArch.Reserved = 0;
        (pResInfo->super_GmmResourceInfoCommon).ExistingSysMem.pExistingSysMem = 0;
        (pResInfo->super_GmmResourceInfoCommon).ExistingSysMem.pVirtAddress = 0;
        (pResInfo->super_GmmResourceInfoCommon).ExistingSysMem.pGfxAlignedVirtAddress = 0;
        (pResInfo->super_GmmResourceInfoCommon).ExistingSysMem.Size = 0;
        *(undefined8 *)&(pResInfo->super_GmmResourceInfoCommon).ExistingSysMem.IsGmmAllocated = 0;
        (pResInfo->super_GmmResourceInfoCommon).SvmAddress = 0;
        goto LAB_001c6bc2;
      }
      (*(pResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[3])(pResInfo);
      this = (GmmClientContext *)pAllocCbs->pUserData;
      UNRECOVERED_JUMPTABLE = pAllocCbs->pfnFree;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      (*UNRECOVERED_JUMPTABLE)(this,pResInfo);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void GMM_STDCALL GmmLib::GmmClientContext::DestroyResInfoObject(GMM_RESOURCE_INFO *           pResInfo,
                                                                GmmClientAllocationCallbacks *pAllocCbs)
{
    __GMM_ASSERTPTR(pResInfo, VOIDRETURN);

    if(!pAllocCbs || !pAllocCbs->pfnFree)
    {
        return DestroyResInfoObject(pResInfo);
    }
    else
    {
        if(pResInfo->GetResFlags().Info.__PreallocatedResInfo)
        {
            *pResInfo = GmmLib::GmmResourceInfo();
        }
        else
        {
#ifdef _WIN32
            pResInfo->~GmmResourceInfoWin();
#else
            pResInfo->~GmmResourceInfoLin();
#endif
            pAllocCbs->pfnFree(pAllocCbs->pUserData, (void *)pResInfo);
            pResInfo = NULL;
        }
    }
}